

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O1

void Gli_ManSimulateSeqPref(Gli_Man_t *p,int nPref)

{
  Gli_Obj_t *pNode;
  int iVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  uint *puVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  Gli_Man_t *p_00;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  
  pVVar5 = p->vCis;
  iVar13 = pVVar5->nSize;
  uVar4 = p->nRegs;
  uVar8 = iVar13 - uVar4;
  p_00 = p;
  if (uVar8 != 0 && (int)uVar4 <= iVar13) {
    lVar12 = 0;
    do {
      p_00 = (Gli_Man_t *)(long)iVar13;
      if ((long)p_00 <= lVar12) goto LAB_006b0cc3;
      piVar2 = p->pObjData;
      if (piVar2 == (int *)0x0) break;
      iVar13 = pVVar5->pArray[lVar12];
      uVar4 = Gia_ManRandom(0);
      piVar2[(long)iVar13 + 4] = uVar4;
      lVar12 = lVar12 + 1;
      pVVar5 = p->vCis;
      iVar13 = pVVar5->nSize;
      uVar4 = p->nRegs;
      uVar8 = iVar13 - uVar4;
      p_00 = (Gli_Man_t *)(long)(int)uVar8;
    } while (lVar12 < (long)p_00);
  }
  if (0 < (int)uVar4) {
    p_00 = (Gli_Man_t *)(ulong)uVar8;
    uVar9 = (ulong)uVar4;
    do {
      if (((int)uVar8 < 0) || (iVar13 <= (int)p_00)) {
LAB_006b0cc3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (p->pObjData == (int *)0x0) break;
      p->pObjData[(long)pVVar5->pArray[(long)p_00] + 4] = 0;
      p_00 = (Gli_Man_t *)((long)&p_00->vCis + 1);
      uVar9 = uVar9 - 1;
    } while (uVar9 != 0);
  }
  if (0 < nPref) {
    iVar13 = 0;
    do {
      if (0 < p->nObjData) {
        uVar9 = 0;
        do {
          if (p->pObjData == (int *)0x0) break;
          pNode = (Gli_Obj_t *)(p->pObjData + uVar9);
          if ((undefined1  [28])((undefined1  [28])*pNode & (undefined1  [28])0x1) ==
              (undefined1  [28])0x0) {
            uVar4 = Gli_ManSimulateSeqNode(p_00,pNode);
            pNode->uSimInfo = uVar4;
          }
          uVar4 = (int)uVar9 + (*(uint *)pNode >> 7) + (*(uint *)pNode >> 4 & 7) + 7;
          uVar9 = (ulong)uVar4;
        } while ((int)uVar4 < p->nObjData);
      }
      lVar12 = (long)p->nRegs;
      if (0 < lVar12) {
        pVVar5 = p->vCos;
        iVar7 = pVVar5->nSize;
        uVar9 = (ulong)(uint)(iVar7 - p->nRegs);
        do {
          if (((int)uVar9 < 0) || (iVar7 <= (int)uVar9)) goto LAB_006b0cc3;
          p_00 = (Gli_Man_t *)p->pObjData;
          if (p_00 == (Gli_Man_t *)0x0) break;
          p_00 = (Gli_Man_t *)((long)&p_00->vCis + (long)pVVar5->pArray[uVar9] * 4);
          *(undefined4 *)&p_00->vCisChanged =
               *(undefined4 *)((long)p_00 + (long)*(int *)((long)&p_00->vAffected + 4) * -4 + 0x10);
          uVar9 = uVar9 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      pVVar5 = p->vCis;
      iVar7 = pVVar5->nSize;
      uVar4 = p->nRegs;
      uVar8 = iVar7 - uVar4;
      if (uVar8 != 0 && (int)uVar4 <= iVar7) {
        lVar12 = 0;
        do {
          p_00 = (Gli_Man_t *)(long)iVar7;
          if ((long)p_00 <= lVar12) goto LAB_006b0cc3;
          piVar2 = p->pObjData;
          if (piVar2 == (int *)0x0) break;
          iVar7 = pVVar5->pArray[lVar12];
          uVar4 = Gia_ManRandom(0);
          piVar2[(long)iVar7 + 4] = uVar4;
          lVar12 = lVar12 + 1;
          pVVar5 = p->vCis;
          iVar7 = pVVar5->nSize;
          uVar4 = p->nRegs;
          uVar8 = iVar7 - uVar4;
          p_00 = (Gli_Man_t *)(long)(int)uVar8;
        } while (lVar12 < (long)p_00);
      }
      if (0 < (int)uVar4) {
        p_00 = (Gli_Man_t *)p->vCos;
        iVar1 = *(int *)((long)&p_00->vCis + 4);
        uVar10 = (ulong)(iVar1 - uVar4);
        uVar11 = (ulong)uVar8;
        uVar9 = (ulong)uVar4;
        do {
          if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_006b0cc3;
          piVar2 = p->pObjData;
          if (piVar2 == (int *)0x0) break;
          if (((int)uVar8 < 0) || (iVar7 <= (int)uVar11)) goto LAB_006b0cc3;
          piVar2[(long)pVVar5->pArray[uVar11] + 4] = piVar2[(long)(&p_00->vCos->nCap)[uVar10] + 4];
          uVar11 = uVar11 + 1;
          uVar10 = uVar10 + 1;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      iVar13 = iVar13 + 1;
    } while (iVar13 != nPref);
  }
  if (p->pSimInfoPrev == (uint *)0x0) {
    puVar6 = (uint *)malloc((long)p->vCis->nSize << 2);
    p->pSimInfoPrev = puVar6;
  }
  pVVar5 = p->vCis;
  if ((0 < pVVar5->nSize) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    piVar3 = pVVar5->pArray;
    puVar6 = p->pSimInfoPrev;
    lVar12 = 0;
    do {
      puVar6[lVar12] = piVar2[(long)piVar3[lVar12] + 4];
      lVar12 = lVar12 + 1;
    } while (lVar12 < pVVar5->nSize);
  }
  return;
}

Assistant:

void Gli_ManSimulateSeqPref( Gli_Man_t * p, int nPref )
{
    Gli_Obj_t * pObj, * pObjRi, * pObjRo;
    int i, f;
    // initialize simulation data
    Gli_ManForEachPi( p, pObj, i )
        pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
    Gli_ManForEachRo( p, pObj, i )
        pObj->uSimInfo = 0;
    for ( f = 0; f < nPref; f++ )
    {
        // simulate one frame
        Gli_ManForEachNode( p, pObj, i )
            pObj->uSimInfo = Gli_ManSimulateSeqNode( p, pObj );
        Gli_ManForEachRi( p, pObj, i )
            pObj->uSimInfo = Gli_ObjFanin(pObj, 0)->uSimInfo;
        // initialize the next frame
        Gli_ManForEachPi( p, pObj, i )
            pObj->uSimInfo = Gli_ManUpdateRandomInput( pObj->uSimInfo, 0.5 );
        Gli_ManForEachRiRo( p, pObjRi, pObjRo, i )
            pObjRo->uSimInfo = pObjRi->uSimInfo;
    }
    // save simulation data after nPref timeframes
    if ( p->pSimInfoPrev == NULL )
        p->pSimInfoPrev = ABC_ALLOC( unsigned, Gli_ManCiNum(p) );
    Gli_ManForEachCi( p, pObj, i )
        p->pSimInfoPrev[i] = pObj->uSimInfo;
}